

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

void fsnav_free_air(void)

{
  fsnav_air *__ptr;
  
  if (fsnav->air != (fsnav_air *)0x0) {
    fsnav->air->cfg = (char *)0x0;
    __ptr = fsnav->air;
    __ptr->cfglength = 0;
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void fsnav_free_air(void)
{
	if (fsnav->air == NULL)
		return;
	
	// configuration
	fsnav->air->cfg = NULL;
	fsnav->air->cfglength = 0;
	
	// air data
	free((void*)(fsnav->air));
}